

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app1.cpp
# Opt level: O2

void __thiscall Vector<int>::Vector(Vector<int> *this,int N)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->N = N;
  uVar4 = 0;
  uVar3 = 0xffffffffffffffff;
  if (-1 < N) {
    uVar3 = (ulong)(uint)N << 2;
  }
  uVar2 = (ulong)(uint)N;
  if (N < 1) {
    uVar2 = uVar4;
  }
  piVar1 = (int *)operator_new__(uVar3);
  this->values = piVar1;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    piVar1[uVar4] = 0;
  }
  return;
}

Assistant:

Vector(int N) : N(N), values(new T[N])
    {
        for(auto i=0; i<N; ++i)
            values[i] = 0;
    }